

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::generate_parents
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *section,string *name,char parentSeparator)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pbVar5;
  undefined8 args;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plist;
  undefined1 local_f8 [17];
  undefined7 uStack_e7;
  size_type sStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  undefined1 local_88 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (section->_M_dataplus)._M_p;
  local_d8._M_allocated_capacity = (size_type)&local_c8;
  local_c8.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar3,pcVar3 + section->_M_string_length);
  local_c8.field_2._8_8_ = name;
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
            (local_d8._M_allocated_capacity,local_d8._M_allocated_capacity + local_d8._8_8_,
             local_d8._M_allocated_capacity);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_f8 + 0x10);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_d8._M_allocated_capacity == &local_c8) {
    sStack_e0 = local_c8._M_string_length;
    local_f8._0_8_ = pbVar2;
  }
  else {
    local_f8._0_8_ = local_d8._M_allocated_capacity;
  }
  stack0xffffffffffffff18 =
       (pointer)CONCAT71(local_c8._M_dataplus._M_p._1_7_,local_c8._M_dataplus._M_p._0_1_);
  local_f8._8_8_ = local_d8._8_8_;
  local_d8._8_8_ = 0;
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_d8._M_allocated_capacity = (size_type)&local_c8;
  iVar7 = ::std::__cxx11::string::compare(local_f8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._0_8_ != pbVar2)
  {
    operator_delete((void *)local_f8._0_8_,
                    (ulong)((long)&(stack0xffffffffffffff18->_M_dataplus)._M_p + 1));
  }
  args = local_c8.field_2._M_allocated_capacity;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_d8._M_allocated_capacity != &local_c8) {
    operator_delete((void *)local_d8._M_allocated_capacity,
                    CONCAT71(local_c8._M_dataplus._M_p._1_7_,local_c8._M_dataplus._M_p._0_1_) + 1);
  }
  if (iVar7 != 0) {
    lVar8 = ::std::__cxx11::string::find((char)section,(ulong)(uint)(int)parentSeparator);
    if (lVar8 == -1) {
      pcVar3 = (section->_M_dataplus)._M_p;
      local_f8._0_8_ = pbVar2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar3,pcVar3 + section->_M_string_length);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,local_f8,
                 &local_d8);
      local_88._16_8_ = stack0xffffffffffffff18;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._0_8_;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._0_8_ ==
          pbVar2) goto LAB_00146a2b;
    }
    else {
      pcVar3 = (section->_M_dataplus)._M_p;
      local_88._0_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar3,pcVar3 + section->_M_string_length);
      split_up(&local_48,(string *)local_88,parentSeparator);
      local_f8._0_8_ = *(undefined8 *)args;
      local_f8._8_8_ = *(undefined8 *)(args + 8);
      unique0x00012000 = *(pointer *)(args + 0x10);
      *(pointer *)args =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(args + 8) =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)(args + 0x10) =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._0_8_;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._0_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 0x10))
      goto LAB_00146a2b;
    }
    operator_delete(pbVar9,(ulong)((long)&(((pointer)local_88._16_8_)->_M_dataplus)._M_p + 1));
  }
LAB_00146a2b:
  uVar6 = local_c8.field_2._8_8_;
  lVar8 = ::std::__cxx11::string::find
                    ((char)local_c8.field_2._8_8_,(ulong)(uint)(int)parentSeparator);
  if (lVar8 != -1) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,*(long *)uVar6,*(long *)uVar6 + *(size_type *)(uVar6 + 8));
    split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f8,&local_a8,parentSeparator);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::string::_M_assign((string *)uVar6);
    pbVar1 = (pointer)(local_f8._8_8_ + -0x20);
    pcVar4 = (((pointer)(local_f8._8_8_ + -0x20))->_M_dataplus)._M_p;
    pbVar5 = (pointer)(local_f8._8_8_ + -0x20);
    local_f8._8_8_ = pbVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &pbVar5->field_2) {
      operator_delete(pcVar4,(pbVar5->field_2)._M_allocated_capacity + 1);
    }
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
               *(undefined8 *)(args + 8),local_f8._0_8_,local_f8._8_8_);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8);
  }
  remove_quotes((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)args);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args;
}

Assistant:

CLI11_INLINE std::vector<std::string>
generate_parents(const std::string &section, std::string &name, char parentSeparator) {
    std::vector<std::string> parents;
    if(detail::to_lower(section) != "default") {
        if(section.find(parentSeparator) != std::string::npos) {
            parents = detail::split_up(section, parentSeparator);
        } else {
            parents = {section};
        }
    }
    if(name.find(parentSeparator) != std::string::npos) {
        std::vector<std::string> plist = detail::split_up(name, parentSeparator);
        name = plist.back();
        plist.pop_back();
        parents.insert(parents.end(), plist.begin(), plist.end());
    }
    // clean up quotes on the parents
    try {
        detail::remove_quotes(parents);
    } catch(const std::invalid_argument &iarg) {
        throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
    }
    return parents;
}